

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O0

void __thiscall echo_server::connection::connection(connection *this,echo_server *parent)

{
  timer *t;
  anon_class_8_1_8991fb9c local_c8;
  callback_t local_c0;
  duration local_a0;
  function<void_()> local_88;
  anon_class_8_1_8991fb9c local_68;
  function<void_()> local_60;
  anon_class_8_1_8991fb9c local_40;
  function<void_()> local_38;
  echo_server *local_18;
  echo_server *parent_local;
  connection *this_local;
  
  this->parent = parent;
  local_40.this = this;
  local_18 = parent;
  parent_local = (echo_server *)this;
  std::function<void()>::function<echo_server::connection::connection(echo_server*)::__0,void>
            ((function<void()> *)&local_38,&local_40);
  local_68.this = this;
  std::function<void()>::function<echo_server::connection::connection(echo_server*)::__1,void>
            ((function<void()> *)&local_60,&local_68);
  std::function<void_()>::function(&local_88);
  server_socket::accept
            ((server_socket *)&this->socket,(int)parent + 8,(sockaddr *)&local_38,
             (socklen_t *)&local_60);
  std::function<void_()>::~function(&local_88);
  std::function<void_()>::~function(&local_60);
  std::function<void_()>::~function(&local_38);
  t = sysapi::epoll::get_timer(local_18->ep);
  local_a0.__r = 15000000000;
  local_c8.this = this;
  std::function<void()>::function<echo_server::connection::connection(echo_server*)::__2,void>
            ((function<void()> *)&local_c0,&local_c8);
  timer_element::timer_element(&this->timer,t,local_a0,&local_c0);
  std::function<void_()>::~function(&local_c0);
  this->start_offset = 0;
  this->end_offset = 0;
  return;
}

Assistant:

echo_server::connection::connection(echo_server *parent)
    : parent(parent)
    , socket(parent->ss.accept([this] {
        this->parent->connections.erase(this);
    }, [this] {
        process(true);
    }, client_socket::on_ready_t{}))
    , timer(parent->ep.get_timer(), timeout, [this] {
        this->parent->connections.erase(this);
    })
    , start_offset()
    , end_offset()
{}